

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

bool __thiscall ftxui::VerticalContainer::EventHandler(VerticalContainer *this,Event *event)

{
  bool bVar1;
  size_type sVar2;
  int *piVar3;
  bool local_f2;
  bool local_c5;
  int local_c4 [2];
  byte local_b9;
  Event local_b8;
  byte local_61;
  Event local_60;
  int local_1c;
  Event *pEStack_18;
  int old_selected;
  Event *event_local;
  VerticalContainer *this_local;
  
  local_1c = *(this->super_ContainerBase).selector_;
  pEStack_18 = event;
  event_local = (Event *)this;
  bVar1 = Event::operator==(event,(Event *)Event::ArrowUp);
  local_61 = 0;
  local_c5 = true;
  if (!bVar1) {
    Event::Character(&local_60,'k');
    local_61 = 1;
    local_c5 = Event::operator==(event,&local_60);
  }
  if ((local_61 & 1) != 0) {
    Event::~Event(&local_60);
  }
  if (local_c5 != false) {
    ftxui::ContainerBase::MoveSelector(&this->super_ContainerBase,-1);
  }
  bVar1 = Event::operator==(event,(Event *)Event::ArrowDown);
  local_b9 = 0;
  local_f2 = true;
  if (!bVar1) {
    Event::Character(&local_b8,'j');
    local_b9 = 1;
    local_f2 = Event::operator==(event,&local_b8);
  }
  if ((local_b9 & 1) != 0) {
    Event::~Event(&local_b8);
  }
  if (local_f2 != false) {
    ftxui::ContainerBase::MoveSelector(&this->super_ContainerBase,1);
  }
  bVar1 = Event::operator==(event,(Event *)Event::Tab);
  if ((bVar1) &&
     (sVar2 = std::
              vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
              ::size(&(this->super_ContainerBase).super_ComponentBase.children_), sVar2 != 0)) {
    ftxui::ContainerBase::MoveSelectorWrap(&this->super_ContainerBase,1);
  }
  bVar1 = Event::operator==(event,(Event *)Event::TabReverse);
  if ((bVar1) &&
     (sVar2 = std::
              vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
              ::size(&(this->super_ContainerBase).super_ComponentBase.children_), sVar2 != 0)) {
    ftxui::ContainerBase::MoveSelectorWrap(&this->super_ContainerBase,-1);
  }
  local_c4[1] = 0;
  sVar2 = std::
          vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
          ::size(&(this->super_ContainerBase).super_ComponentBase.children_);
  local_c4[0] = (int)sVar2 + -1;
  piVar3 = std::min<int>(local_c4,(this->super_ContainerBase).selector_);
  piVar3 = std::max<int>(local_c4 + 1,piVar3);
  *(this->super_ContainerBase).selector_ = *piVar3;
  return local_1c != *(this->super_ContainerBase).selector_;
}

Assistant:

bool EventHandler(Event event) override {
    int old_selected = *selector_;
    if (event == Event::ArrowUp || event == Event::Character('k'))
      MoveSelector(-1);
    if (event == Event::ArrowDown || event == Event::Character('j'))
      MoveSelector(+1);
    if (event == Event::Tab && children_.size())
      MoveSelectorWrap(+1);
    if (event == Event::TabReverse && children_.size())
      MoveSelectorWrap(-1);

    *selector_ = std::max(0, std::min(int(children_.size()) - 1, *selector_));
    return old_selected != *selector_;
  }